

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O2

void __thiscall wallet::PageHeader::Unserialize<AutoFile>(PageHeader *this,AutoFile *s)

{
  uint16_t *puVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint8_t uVar5;
  PageType PVar6;
  uint16_t uVar7;
  uint32_t uVar8;
  runtime_error *this_00;
  uint uVar9;
  long in_FS_OFFSET;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = ser_readdata32<AutoFile>(s);
  this->lsn_file = uVar8;
  uVar8 = ser_readdata32<AutoFile>(s);
  this->lsn_offset = uVar8;
  uVar8 = ser_readdata32<AutoFile>(s);
  this->page_num = uVar8;
  uVar8 = ser_readdata32<AutoFile>(s);
  this->prev_page = uVar8;
  uVar8 = ser_readdata32<AutoFile>(s);
  this->next_page = uVar8;
  uVar7 = ser_readdata16<AutoFile>(s);
  this->entries = uVar7;
  uVar7 = ser_readdata16<AutoFile>(s);
  this->hf_offset = uVar7;
  uVar5 = ser_readdata8<AutoFile>(s);
  this->level = uVar5;
  PVar6 = ser_readdata8<AutoFile>(s);
  this->type = PVar6;
  uVar9 = this->page_num;
  if (this->other_endian == true) {
    uVar2 = this->lsn_file;
    uVar3 = this->lsn_offset;
    this->lsn_file = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
    ;
    this->lsn_offset =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    this->page_num = uVar9;
    uVar2 = this->prev_page;
    this->prev_page =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = this->next_page;
    this->next_page =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    puVar1 = &this->entries;
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    puVar1 = &this->hf_offset;
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  }
  if (this->expected_page_num == uVar9) {
    if ((this->level == '\0') != (PVar6 != OVERFLOW_DATA)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
        return;
      }
      goto LAB_004a9a6c;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Bad btree level");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Page number mismatch");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_004a9a6c:
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> lsn_file;
        s >> lsn_offset;
        s >> page_num;
        s >> prev_page;
        s >> next_page;
        s >> entries;
        s >> hf_offset;
        s >> level;

        uint8_t uint8_type;
        s >> uint8_type;
        type = static_cast<PageType>(uint8_type);

        if (other_endian) {
            lsn_file = internal_bswap_32(lsn_file);
            lsn_offset = internal_bswap_32(lsn_offset);
            page_num = internal_bswap_32(page_num);
            prev_page = internal_bswap_32(prev_page);
            next_page = internal_bswap_32(next_page);
            entries = internal_bswap_16(entries);
            hf_offset = internal_bswap_16(hf_offset);
        }

        if (expected_page_num != page_num) {
            throw std::runtime_error("Page number mismatch");
        }
        if ((type != PageType::OVERFLOW_DATA && level < 1) || (type == PageType::OVERFLOW_DATA && level != 0)) {
            throw std::runtime_error("Bad btree level");
        }
    }